

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles2::Functional::eval_refract_float(ShaderEvalContext *c)

{
  float n;
  float *pfVar1;
  float fVar2;
  ShaderEvalContext *c_local;
  
  pfVar1 = tcu::Vector<float,_4>::z(c->in);
  fVar2 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::x(c->in + 1);
  n = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::y(c->in + 2);
  fVar2 = tcu::refract(fVar2,n,*pfVar1);
  pfVar1 = tcu::Vector<float,_4>::x(&c->color);
  *pfVar1 = fVar2;
  return;
}

Assistant:

void eval_refract_float	(ShaderEvalContext& c) { c.color.x()	= refract(c.in[0].z(),                 c.in[1].x(),                 c.in[2].y()); }